

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreaterThan.hpp
# Opt level: O0

IsGreaterThan<int> * __thiscall
ut11::Operands::IsGreaterThan<int>::GetErrorMessage<int>(IsGreaterThan<int> *this,int *actual)

{
  ostream *poVar1;
  int *in_RDX;
  utility local_1f8 [32];
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  int *local_20;
  int *actual_local;
  IsGreaterThan<int> *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected greater than ");
  utility::ToString<int>(local_1d8,*(int **)actual);
  poVar1 = std::operator<<(poVar1,(string *)local_1d8);
  poVar1 = std::operator<<(poVar1," but was ");
  utility::ToString<int>(local_1f8,local_20);
  std::operator<<(poVar1,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const Q& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected greater than " << ut11::utility::ToString(low) << " but was " << ut11::utility::ToString(actual);
				return errorMessage.str();
			}